

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_reference
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write,
          ReturnType t)

{
  ushort uVar1;
  ImageObject *pIVar2;
  pointer psVar3;
  ushort *puVar4;
  bool bVar5;
  Atom *pAVar6;
  ushort *puVar7;
  ulong uVar8;
  uint32_t cast_opcode;
  uint16_t index;
  vector<short,_std::allocator<short>_> v;
  Atom local_c4 [4];
  Atom local_c0 [6];
  ushort local_ba;
  _Vector_base<short,_std::allocator<short>_> local_b8;
  ulong local_a0;
  ushort *local_98;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_98 = extent_index;
  if (((t == ANY) || ((this->current_class).type == t)) &&
     (bVar5 = std::operator==(&((node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cmd,"this"), bVar5)) {
    if (!write) {
      return true;
    }
    r_code::Atom::This();
    pAVar6 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(pAVar6,(Atom *)&local_b8);
  }
  else {
    local_a0 = (ulong)write_index;
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    bVar5 = local_reference(this,(Ptr *)&local_40,&local_ba,t);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (bVar5) {
      if (!write) {
        return true;
      }
      r_code::Atom::VLPointer((ushort)&local_b8,local_ba);
      pAVar6 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
      r_code::Atom::operator=(pAVar6,(Atom *)&local_b8);
    }
    else {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar5 = global_reference(this,(Ptr *)&local_50,&local_ba,t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if (!bVar5) {
        local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar5 = this_indirection(this,(Ptr *)&local_60,
                                 (vector<short,_std::allocator<short>_> *)&local_b8,t);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        puVar4 = local_98;
        if (bVar5) {
          bVar5 = true;
          if (write) {
            r_code::Atom::IPointer((ushort)local_c0);
            pAVar6 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
            r_code::Atom::operator=(pAVar6,local_c0);
            r_code::Atom::~Atom(local_c0);
            r_code::Atom::CPointer((uchar)local_c0);
            pIVar2 = this->current_object;
            uVar1 = *puVar4;
            *puVar4 = uVar1 + 1;
            pAVar6 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
            r_code::Atom::operator=(pAVar6,local_c0);
            r_code::Atom::~Atom(local_c0);
            r_code::Atom::This();
            pIVar2 = this->current_object;
            uVar1 = *puVar4;
            *puVar4 = uVar1 + 1;
            pAVar6 = r_code::vector<r_code::Atom>::operator[]
                               ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
            r_code::Atom::operator=(pAVar6,local_c0);
            r_code::Atom::~Atom(local_c0);
            psVar3 = local_b8._M_impl.super__Vector_impl_data._M_finish;
            for (puVar7 = (ushort *)local_b8._M_impl.super__Vector_impl_data._M_start;
                puVar7 != (ushort *)psVar3; puVar7 = puVar7 + 1) {
              uVar1 = *puVar7;
              if (uVar1 == 0xfffd) {
                r_code::Atom::Vws();
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c0);
              }
              else if (uVar1 == 0xfffe) {
                r_code::Atom::Mks();
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c0);
              }
              else if (uVar1 == 0xffff) {
                r_code::Atom::View();
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c0);
              }
              else {
                r_code::Atom::IPointer((ushort)local_c0);
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c0);
              }
              r_code::Atom::~Atom(local_c0);
            }
          }
        }
        else {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar5 = local_indirection(this,(Ptr *)&local_70,
                                    (vector<short,_std::allocator<short>_> *)&local_b8,t,
                                    (uint32_t *)local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          puVar4 = local_98;
          if (bVar5) {
            bVar5 = true;
            if (write) {
              r_code::Atom::IPointer((ushort)local_c4);
              pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
              r_code::Atom::operator=(pAVar6,local_c4);
              r_code::Atom::~Atom(local_c4);
              r_code::Atom::CPointer((uchar)local_c4);
              pIVar2 = this->current_object;
              uVar1 = *puVar4;
              *puVar4 = uVar1 + 1;
              pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar6,local_c4);
              r_code::Atom::~Atom(local_c4);
              r_code::Atom::VLPointer
                        ((ushort)local_c4,*local_b8._M_impl.super__Vector_impl_data._M_start);
              pIVar2 = this->current_object;
              uVar1 = *puVar4;
              *puVar4 = uVar1 + 1;
              pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                 ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar6,local_c4);
              r_code::Atom::~Atom(local_c4);
              for (uVar8 = 1; uVar8 = uVar8 & 0xffff,
                  uVar8 < (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 1);
                  uVar8 = (ulong)((int)uVar8 + 1)) {
                uVar1 = local_b8._M_impl.super__Vector_impl_data._M_start[uVar8];
                if (uVar1 == 0xfffd) {
                  r_code::Atom::Vws();
                  pIVar2 = this->current_object;
                  uVar1 = *puVar4;
                  *puVar4 = uVar1 + 1;
                  pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar6,local_c4);
                }
                else if (uVar1 == 0xfffe) {
                  r_code::Atom::Mks();
                  pIVar2 = this->current_object;
                  uVar1 = *puVar4;
                  *puVar4 = uVar1 + 1;
                  pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar6,local_c4);
                }
                else if (uVar1 == 0xffff) {
                  r_code::Atom::View();
                  pIVar2 = this->current_object;
                  uVar1 = *puVar4;
                  *puVar4 = uVar1 + 1;
                  pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar6,local_c4);
                }
                else {
                  r_code::Atom::IPointer((ushort)local_c4);
                  pIVar2 = this->current_object;
                  uVar1 = *puVar4;
                  *puVar4 = uVar1 + 1;
                  pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                     ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                  r_code::Atom::operator=(pAVar6,local_c4);
                }
                r_code::Atom::~Atom(local_c4);
              }
            }
          }
          else {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar5 = global_indirection(this,(Ptr *)&local_80,
                                       (vector<short,_std::allocator<short>_> *)&local_b8,t);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
            puVar4 = local_98;
            if (bVar5) {
              bVar5 = true;
              if (write) {
                r_code::Atom::IPointer((ushort)local_c4);
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
                r_code::Atom::operator=(pAVar6,local_c4);
                r_code::Atom::~Atom(local_c4);
                r_code::Atom::CPointer((uchar)local_c4);
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c4);
                r_code::Atom::~Atom(local_c4);
                r_code::Atom::RPointer((ushort)local_c4);
                pIVar2 = this->current_object;
                uVar1 = *puVar4;
                *puVar4 = uVar1 + 1;
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar6,local_c4);
                r_code::Atom::~Atom(local_c4);
                for (uVar8 = 1; uVar8 = uVar8 & 0xffff,
                    uVar8 < (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 1);
                    uVar8 = (ulong)((int)uVar8 + 1)) {
                  if (local_b8._M_impl.super__Vector_impl_data._M_start[uVar8] == 0xfffd) {
                    r_code::Atom::Vws();
                    pIVar2 = this->current_object;
                    uVar1 = *puVar4;
                    *puVar4 = uVar1 + 1;
                    pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar6,local_c4);
                  }
                  else if (local_b8._M_impl.super__Vector_impl_data._M_start[uVar8] == 0xfffe) {
                    r_code::Atom::Mks();
                    pIVar2 = this->current_object;
                    uVar1 = *puVar4;
                    *puVar4 = uVar1 + 1;
                    pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar6,local_c4);
                  }
                  else {
                    r_code::Atom::IPointer((ushort)local_c4);
                    pIVar2 = this->current_object;
                    uVar1 = *puVar4;
                    *puVar4 = uVar1 + 1;
                    pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
                    r_code::Atom::operator=(pAVar6,local_c4);
                  }
                  r_code::Atom::~Atom(local_c4);
                }
              }
            }
            else {
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_90,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              bVar5 = hlp_reference(this,(Ptr *)&local_90,&local_ba);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_90._M_refcount);
              if (write && bVar5) {
                r_code::Atom::VLPointer((ushort)local_c4,local_ba);
                pAVar6 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
                r_code::Atom::operator=(pAVar6,local_c4);
                r_code::Atom::~Atom(local_c4);
                bVar5 = true;
              }
            }
          }
        }
        std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_b8);
        return bVar5;
      }
      if (!write) {
        return true;
      }
      r_code::Atom::RPointer((ushort)&local_b8);
      pAVar6 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),local_a0);
      r_code::Atom::operator=(pAVar6,(Atom *)&local_b8);
    }
  }
  r_code::Atom::~Atom((Atom *)&local_b8);
  return true;
}

Assistant:

bool Compiler::read_reference(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write, const ReturnType t)
{
    uint16_t index;

    if ((t == ANY || (t != ANY && current_class.type == t)) && node->cmd == "this") {
        if (write) {
            current_object->code[write_index] = Atom::This();
        }

        return true;
    }

    if (local_reference(node, index, t)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);    // local references are always pointing to the value array
        }

        return true;
    }

    if (global_reference(node, index, t)) { // index is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::RPointer(index);
        }

        return true;
    }

    std::vector<int16_t> v;

    if (this_indirection(node, v, t)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size() + 1);
            current_object->code[extent_index++] = Atom::This();

            for (int16_t type : v) {
                switch (type) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(type);
                    break;
                }
            }
        }

        return true;
    }

    uint32_t cast_opcode;

    if (local_indirection(node, v, t, cast_opcode)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::VLPointer(v[0], cast_opcode);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (global_indirection(node, v, t)) { // v[0] is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::RPointer(v[0]);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (hlp_reference(node, index)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);
        }

        return true;
    }

    return false;
}